

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O2

int archive_write_zip_finish_entry(archive_write *a)

{
  zip_conflict *zip;
  int64_t iVar1;
  uint64_t u;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  undefined1 uVar5;
  size_t in_len;
  uchar *p;
  undefined1 *puVar6;
  size_t sStack_80;
  size_t outl;
  undefined4 uStack_70;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61 [9];
  archive_hmac_sha1_ctx *local_58;
  code *local_50;
  archive_crypto_ctx *local_48;
  code *local_40;
  size_t hmac_len;
  
  zip = (zip_conflict *)a->format_data;
  if (zip->entry_compression == COMPRESSION_DEFLATE) {
    local_40 = aes_ctr_update;
    local_48 = &zip->cctx;
    local_50 = __hmac_sha1_update;
    local_58 = &zip->hctx;
    while( true ) {
      iVar2 = cm_zlib_deflate((z_streamp_conflict)&zip->stream,4);
      if (iVar2 == -2) {
        return -0x1e;
      }
      in_len = zip->len_buf - (ulong)(zip->stream).avail_out;
      if (zip->tctx_valid == '\0') {
        if (zip->cctx_valid != '\0') {
          outl._0_2_ = (undefined2)in_len;
          outl._2_2_ = (short)(in_len >> 0x10);
          outl._4_4_ = (uint32_t)(in_len >> 0x20);
          iVar2 = (*local_40)(local_48,zip->buf,in_len,zip->buf,&outl);
          if (iVar2 < 0) {
            archive_set_error(&a->archive,-1,"Failed to encrypt file");
            return -0x19;
          }
          (*local_50)(local_58,zip->buf,in_len);
        }
      }
      else {
        trad_enc_encrypt_update(&zip->tctx,zip->buf,in_len,zip->buf,in_len);
      }
      iVar2 = __archive_write_output(a,zip->buf,in_len);
      if (iVar2 != 0) {
        return iVar2;
      }
      zip->entry_compressed_written = zip->entry_compressed_written + in_len;
      zip->written_bytes = zip->written_bytes + in_len;
      (zip->stream).next_out = zip->buf;
      if ((zip->stream).avail_out != 0) break;
      (zip->stream).avail_out = (uInt)zip->len_buf;
    }
    cm_zlib_deflateEnd((z_streamp_conflict)&zip->stream);
  }
  if (zip->hctx_valid != '\0') {
    hmac_len = 0x14;
    __hmac_sha1_final(&zip->hctx,(uint8_t *)&outl,&hmac_len);
    iVar2 = __archive_write_output(a,&outl,10);
    if (iVar2 != 0) {
      return iVar2;
    }
    zip->entry_compressed_written = zip->entry_compressed_written + 10;
    zip->written_bytes = zip->written_bytes + 10;
  }
  if ((zip->entry_flags & 8) != 0) {
    outl._0_2_ = 0x4b50;
    outl._2_2_ = 0x807;
    if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
      outl._4_4_ = zip->entry_crc32;
    }
    else {
      outl._4_4_ = 0;
    }
    iVar1 = zip->entry_compressed_written;
    uStack_70 = (undefined4)iVar1;
    if (zip->entry_uses_zip64 == 0) {
      puVar6 = &local_69;
      iVar1 = zip->entry_uncompressed_written;
      local_6c = (undefined1)iVar1;
      local_6b = (undefined1)((ulong)iVar1 >> 8);
      local_6a = (undefined1)((ulong)iVar1 >> 0x10);
      uVar5 = (undefined1)((ulong)iVar1 >> 0x18);
      sStack_80 = 0x10;
    }
    else {
      puVar6 = local_61;
      local_6c = (undefined1)((ulong)iVar1 >> 0x20);
      local_6b = (undefined1)((ulong)iVar1 >> 0x28);
      local_6a = (undefined1)((ulong)iVar1 >> 0x30);
      local_69 = (undefined1)((ulong)iVar1 >> 0x38);
      iVar1 = zip->entry_uncompressed_written;
      local_68 = (undefined1)iVar1;
      local_67 = (undefined1)((ulong)iVar1 >> 8);
      local_66 = (undefined1)((ulong)iVar1 >> 0x10);
      local_65 = (undefined1)((ulong)iVar1 >> 0x18);
      local_64 = (undefined1)((ulong)iVar1 >> 0x20);
      local_63 = (undefined1)((ulong)iVar1 >> 0x28);
      local_62 = (undefined1)((ulong)iVar1 >> 0x30);
      uVar5 = (undefined1)((ulong)iVar1 >> 0x38);
      sStack_80 = 0x18;
    }
    *puVar6 = uVar5;
    iVar2 = __archive_write_output(a,&outl,sStack_80);
    zip->written_bytes = zip->written_bytes + sStack_80;
    if (iVar2 != 0) {
      return -0x1e;
    }
  }
  u = zip->entry_compressed_written;
  lVar4 = zip->entry_uncompressed_written;
  if ((long)u < 0x100000000) {
    if (lVar4 < 0x100000000) {
      if (zip->entry_offset < 0x100000000) goto LAB_0037a1df;
      goto LAB_0037a112;
    }
LAB_0037a14b:
    puVar6 = &local_6c;
    outl._4_4_ = (uint32_t)lVar4;
    uStack_70 = (undefined4)((ulong)lVar4 >> 0x20);
  }
  else {
LAB_0037a112:
    puVar6 = (undefined1 *)((long)&outl + 4);
    if (0xfffffffe < lVar4) goto LAB_0037a14b;
  }
  outl._2_2_ = 0;
  outl._0_2_ = 1;
  if (0xfffffffe < (long)u) {
    archive_le64enc(puVar6,u);
    puVar6 = puVar6 + 8;
  }
  if (0xfffffffe < zip->entry_offset) {
    archive_le64enc(puVar6,zip->entry_offset);
    puVar6 = puVar6 + 8;
  }
  outl._2_2_ = (short)puVar6 - ((short)&outl + 4);
  puVar3 = cd_alloc(zip,(long)puVar6 - (long)&outl);
  if (puVar3 == (uchar *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate zip data");
    return -0x1e;
  }
  memcpy(puVar3,&outl,(long)puVar6 - (long)&outl);
  puVar3 = zip->file_header;
  if (*(ushort *)(puVar3 + 6) < 0x2d) {
    puVar3[6] = '-';
    puVar3[7] = '\0';
  }
LAB_0037a1df:
  if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
    *(uint32_t *)(zip->file_header + 0x10) = zip->entry_crc32;
  }
  else {
    puVar3 = zip->file_header;
    puVar3[0x10] = '\0';
    puVar3[0x11] = '\0';
    puVar3[0x12] = '\0';
    puVar3[0x13] = '\0';
  }
  lVar4 = zip->entry_compressed_written;
  if (0xfffffffe < lVar4) {
    lVar4 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x14) = (int)lVar4;
  lVar4 = zip->entry_uncompressed_written;
  if (0xfffffffe < lVar4) {
    lVar4 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x18) = (int)lVar4;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  lVar4 = 0xffffffff;
  if (zip->entry_offset < 0xffffffff) {
    lVar4 = zip->entry_offset;
  }
  *(int *)(zip->file_header + 0x2a) = (int)lVar4;
  return 0;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;

#if HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		for (;;) {
			size_t remainder;

			ret = deflate(&zip->stream, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.next_out = zip->buf;
			if (zip->stream.avail_out != 0)
				break;
			zip->stream.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream);
	}
#endif
	if (zip->hctx_valid) {
		uint8_t hmac[20];
		size_t hmac_len = 20;

		archive_hmac_sha1_final(&zip->hctx, hmac, &hmac_len);
		ret = __archive_write_output(a, hmac, AUTH_CODE_SIZE);
		if (ret != ARCHIVE_OK)
			return (ret);
		zip->entry_compressed_written += AUTH_CODE_SIZE;
		zip->written_bytes += AUTH_CODE_SIZE;
	}

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
			archive_le32enc(d + 4, 0);/* no CRC.*/
		else
			archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_uses_zip64) {
			archive_le64enc(d + 8,
				(uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16,
				(uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8,
				(uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12,
				(uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Append Zip64 extra data to central directory information. */
	if (zip->entry_compressed_written > ZIP_4GB_MAX
	    || zip->entry_uncompressed_written > ZIP_4GB_MAX
	    || zip->entry_offset > ZIP_4GB_MAX) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= ZIP_4GB_MAX) {
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= ZIP_4GB_MAX) {
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= ZIP_4GB_MAX) {
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, (uint16_t)(z - (zip64 + 4)));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
		(uint32_t)zipmin(zip->entry_compressed_written,
				 ZIP_4GB_MAX));
	archive_le32enc(zip->file_header + 24,
		(uint32_t)zipmin(zip->entry_uncompressed_written,
				 ZIP_4GB_MAX));
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42,
		(uint32_t)zipmin(zip->entry_offset,
				 ZIP_4GB_MAX));

	return (ARCHIVE_OK);
}